

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

void __thiscall TCLAP::CmdLine::CmdLine(CmdLine *this,string *m,char delim,string *v,bool help)

{
  allocator local_49;
  XorHandler *local_48;
  string *local_40;
  string *local_38;
  
  (this->super_CmdLineInterface)._vptr_CmdLineInterface = (_func_int **)&PTR__CmdLine_00159210;
  (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_argList;
  (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_argList;
  (this->_argList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node.
  _M_size = 0;
  local_38 = &this->_progName;
  std::__cxx11::string::string((string *)local_38,"not_set_yet",&local_49);
  local_40 = &this->_message;
  std::__cxx11::string::string((string *)local_40,(string *)m);
  std::__cxx11::string::string((string *)&this->_version,(string *)v);
  this->_numRequired = 0;
  this->_delimiter = delim;
  local_48 = &this->_xorHandler;
  (this->_xorHandler)._orList.
  super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_xorHandler)._orList.
  super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_xorHandler)._orList.
  super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_argDeleteOnExitList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_argDeleteOnExitList;
  (this->_argDeleteOnExitList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_argDeleteOnExitList;
  (this->_argDeleteOnExitList).super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
  ._M_node._M_size = 0;
  (this->_visitorDeleteOnExitList).
  super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_visitorDeleteOnExitList;
  (this->_visitorDeleteOnExitList).
  super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_visitorDeleteOnExitList;
  (this->_visitorDeleteOnExitList).
  super__List_base<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>._M_impl._M_node._M_size = 0;
  this->_output = (CmdLineOutput *)0x0;
  this->_handleExceptions = true;
  this->_userSetOutput = false;
  this->_helpAndVersion = help;
  _constructor(this);
  return;
}

Assistant:

inline CmdLine::CmdLine(const std::string& m,
                        char delim,
                        const std::string& v,
                        bool help )
    :
  _argList(std::list<Arg*>()),
  _progName("not_set_yet"),
  _message(m),
  _version(v),
  _numRequired(0),
  _delimiter(delim),
  _xorHandler(XorHandler()),
  _argDeleteOnExitList(std::list<Arg*>()),
  _visitorDeleteOnExitList(std::list<Visitor*>()),
  _output(0),
  _handleExceptions(true),
  _userSetOutput(false),
  _helpAndVersion(help)
{
	_constructor();
}